

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

int __thiscall filtered_union_find::link(filtered_union_find *this,char *__from,char *__to)

{
  pointer pvVar1;
  vector<long,std::allocator<long>> *pvVar2;
  float fVar3;
  float fVar4;
  pointer plVar5;
  long lVar6;
  long lVar7;
  pointer pfVar8;
  int in_EAX;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  pointer pvVar13;
  long *plVar14;
  
  plVar5 = (this->parent).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = plVar5[(long)__from];
  lVar7 = plVar5[(long)__to];
  if (lVar6 == lVar7) {
    return in_EAX;
  }
  pfVar8 = (this->filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar3 = pfVar8[lVar6];
  fVar4 = pfVar8[lVar7];
  if (fVar4 <= fVar3) {
    pvVar13 = (this->rank).
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = pvVar13 + lVar6;
    if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
      plVar12 = (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      plVar14 = *(pointer *)
                 ((long)&(pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data + 8);
      plVar10 = plVar12;
    }
    else {
      plVar12 = (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      plVar14 = *(pointer *)
                 ((long)&(pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data + 8);
      plVar9 = pvVar13[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar11 = *(pointer *)
                 ((long)&pvVar13[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8);
      plVar10 = plVar12;
      if ((ulong)((long)plVar11 - (long)plVar9) < (ulong)((long)plVar14 - (long)plVar12))
      goto joined_r0x0011d4a2;
    }
    for (; plVar12 != plVar14; plVar12 = plVar12 + 1) {
      plVar5[*plVar12] = lVar7;
    }
    std::vector<long,std::allocator<long>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
              ((vector<long,std::allocator<long>> *)(pvVar13 + lVar7),
               *(undefined8 *)((vector<long,std::allocator<long>> *)(pvVar13 + lVar7) + 8),plVar10,
               plVar14);
  }
  else {
    pvVar13 = (this->rank).
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    plVar9 = pvVar13[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar11 = *(pointer *)
               ((long)&pvVar13[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data + 8);
joined_r0x0011d4a2:
    for (; plVar9 != plVar11; plVar9 = plVar9 + 1) {
      plVar5[*plVar9] = lVar6;
    }
    pvVar2 = (vector<long,std::allocator<long>> *)((long)pvVar13 + lVar6 * 0x18);
    std::vector<long,std::allocator<long>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
              (pvVar2,*(undefined8 *)(pvVar2 + 8));
  }
  return (int)(this->filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
}

Assistant:

value_t link(index_t x, index_t y) {
		x = find(x);
		y = find(y);
		if (x == y) return -1;
		if (filtration[x] < filtration[y] || (filtration[x] == filtration[y] && rank[x].size() > rank[y].size())){
			for(auto i : rank[y]) parent[i] = x;
			rank[x].insert(rank[x].end(),rank[y].begin(),rank[y].end());
			return filtration[y];
		} else {
			for(auto i : rank[x]) parent[i] = y;
			rank[y].insert(rank[y].end(),rank[x].begin(),rank[x].end());
			return filtration[x];
		}
	}